

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_padding.cpp
# Opt level: O2

int32_t __thiscall
icu_63::number::impl::Padder::padAndApply
          (Padder *this,Modifier *mod1,Modifier *mod2,NumberStringBuilder *string,int32_t leftIndex,
          int32_t rightIndex,UErrorCode *status)

{
  UChar32 paddingCp;
  UNumberFormatPadPosition UVar1;
  int iVar2;
  int iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int iVar6;
  
  iVar2 = (*mod1->_vptr_Modifier[4])(mod1);
  iVar3 = (*mod2->_vptr_Modifier[4])(mod2);
  iVar6 = this->fWidth;
  iVar4 = NumberStringBuilder::codePointCount(string);
  iVar6 = iVar6 - (iVar3 + iVar2 + iVar4);
  if (iVar6 < 1) {
    iVar6 = (*mod1->_vptr_Modifier[2])(mod1,string,(ulong)(uint)leftIndex,rightIndex,status);
    iVar2 = (*mod2->_vptr_Modifier[2])
                      (mod2,string,(ulong)(uint)leftIndex,(ulong)(uint)(rightIndex + iVar6),status);
    iVar4 = iVar2 + iVar6;
  }
  else {
    paddingCp = (this->fUnion).padding.fCp;
    UVar1 = (this->fUnion).padding.fPosition;
    iVar4 = leftIndex;
    if ((UVar1 == UNUM_PAD_AFTER_PREFIX) ||
       (iVar5 = 0, iVar4 = rightIndex, UVar1 == UNUM_PAD_BEFORE_SUFFIX)) {
      iVar5 = anon_unknown.dwarf_198b44::addPaddingHelper(paddingCp,iVar6,string,iVar4,status);
    }
    iVar2 = (*mod1->_vptr_Modifier[2])
                      (mod1,string,(ulong)(uint)leftIndex,(ulong)(uint)(rightIndex + iVar5),status);
    iVar3 = (*mod2->_vptr_Modifier[2])
                      (mod2,string,(ulong)(uint)leftIndex,(ulong)(uint)(iVar2 + iVar5 + rightIndex),
                       status);
    iVar3 = iVar3 + iVar2 + iVar5;
    if (UVar1 == UNUM_PAD_AFTER_SUFFIX) {
      leftIndex = rightIndex + iVar3;
    }
    else if (UVar1 != UNUM_PAD_BEFORE_PREFIX) {
      return iVar3;
    }
    iVar4 = anon_unknown.dwarf_198b44::addPaddingHelper(paddingCp,iVar6,string,leftIndex,status);
    iVar4 = iVar3 + iVar4;
  }
  return iVar4;
}

Assistant:

int32_t Padder::padAndApply(const Modifier &mod1, const Modifier &mod2,
                            NumberStringBuilder &string, int32_t leftIndex, int32_t rightIndex,
                            UErrorCode &status) const {
    int32_t modLength = mod1.getCodePointCount() + mod2.getCodePointCount();
    int32_t requiredPadding = fWidth - modLength - string.codePointCount();
    U_ASSERT(leftIndex == 0 &&
             rightIndex == string.length()); // fix the previous line to remove this assertion

    int length = 0;
    if (requiredPadding <= 0) {
        // Padding is not required.
        length += mod1.apply(string, leftIndex, rightIndex, status);
        length += mod2.apply(string, leftIndex, rightIndex + length, status);
        return length;
    }

    PadPosition position = fUnion.padding.fPosition;
    UChar32 paddingCp = fUnion.padding.fCp;
    if (position == UNUM_PAD_AFTER_PREFIX) {
        length += addPaddingHelper(paddingCp, requiredPadding, string, leftIndex, status);
    } else if (position == UNUM_PAD_BEFORE_SUFFIX) {
        length += addPaddingHelper(paddingCp, requiredPadding, string, rightIndex + length, status);
    }
    length += mod1.apply(string, leftIndex, rightIndex + length, status);
    length += mod2.apply(string, leftIndex, rightIndex + length, status);
    if (position == UNUM_PAD_BEFORE_PREFIX) {
        length += addPaddingHelper(paddingCp, requiredPadding, string, leftIndex, status);
    } else if (position == UNUM_PAD_AFTER_SUFFIX) {
        length += addPaddingHelper(paddingCp, requiredPadding, string, rightIndex + length, status);
    }

    return length;
}